

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Scene::update(Scene *this,ResourcePack *resource_pack)

{
  PFNGLBUFFERDATAPROC p_Var1;
  GLenum GVar2;
  size_type sVar3;
  float *pfVar4;
  uint *puVar5;
  ostream *poVar6;
  Mesh *this_00;
  Mesh *objmesh;
  allocator local_69;
  undefined1 local_68 [8];
  string box_mesh;
  value_type_conflict2 local_40;
  value_type_conflict2 local_3c;
  value_type_conflict2 local_38;
  value_type_conflict2 local_34;
  value_type_conflict2 local_30;
  float local_2c;
  value_type_conflict local_28;
  float local_24;
  int local_20;
  int local_1c;
  int j;
  int i;
  ResourcePack *resource_pack_local;
  Scene *this_local;
  
  _j = resource_pack;
  resource_pack_local = (ResourcePack *)this;
  std::vector<float,_std::allocator<float>_>::reserve
            (&this->grid_vertices,(long)((this->grid_height + 1) * (this->grid_width + 1)));
  for (local_1c = 0; local_1c < this->grid_height + 1; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < this->grid_width + 1; local_20 = local_20 + 1) {
      local_24 = (float)(this->grid_start_x + this->grid_cell_size * local_20);
      std::vector<float,_std::allocator<float>_>::push_back(&this->grid_vertices,&local_24);
      local_28 = -1.0;
      std::vector<float,_std::allocator<float>_>::push_back(&this->grid_vertices,&local_28);
      local_2c = (float)(this->grid_start_y + this->grid_cell_size * local_1c);
      std::vector<float,_std::allocator<float>_>::push_back(&this->grid_vertices,&local_2c);
      if ((local_1c < this->grid_height) && (local_20 < this->grid_height)) {
        local_30 = local_1c * (this->grid_height + 1) + local_20;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->grid_indices,&local_30);
        local_34 = local_1c * (this->grid_height + 1) + local_20 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->grid_indices,&local_34);
        local_38 = (local_1c + 1) * (this->grid_height + 1) + local_20;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->grid_indices,&local_38);
        local_3c = local_1c * (this->grid_height + 1) + local_20 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->grid_indices,&local_3c);
        local_40 = (local_1c + 1) * (this->grid_height + 1) + local_20;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->grid_indices,&local_40);
        box_mesh.field_2._12_4_ = (local_1c + 1) * (this->grid_height + 1) + local_20 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->grid_indices,(value_type_conflict2 *)(box_mesh.field_2._M_local_buf + 0xc)
                  );
      }
    }
  }
  (*__glewGenBuffers)(1,&this->grid_vertex_buffer);
  (*__glewBindBuffer)(0x8892,this->grid_vertex_buffer);
  p_Var1 = __glewBufferData;
  sVar3 = std::vector<float,_std::allocator<float>_>::size(&this->grid_vertices);
  pfVar4 = std::vector<float,_std::allocator<float>_>::data(&this->grid_vertices);
  (*p_Var1)(0x8892,sVar3 << 2,pfVar4,0x88e4);
  (*__glewGenBuffers)(1,&this->grid_index_buffer);
  (*__glewBindBuffer)(0x8893,this->grid_index_buffer);
  p_Var1 = __glewBufferData;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->grid_indices);
  puVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&this->grid_indices);
  (*p_Var1)(0x8893,sVar3 << 2,puVar5,0x88e4);
  (*__glewGenFramebuffers)(1,&this->depth_map_framebuffer);
  glGenTextures(1,&this->depth_map);
  glBindTexture(0xde1,this->depth_map);
  glTexImage2D(0xde1,0,0x1902,this->shadow_width,this->shadow_height,0,0x1902,0x1406,0);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  (*__glewBindFramebuffer)(0x8d40,this->depth_map_framebuffer);
  (*__glewFramebufferTexture2D)(0x8d40,0x8d00,0xde1,this->depth_map,0);
  glDrawBuffer(0);
  glReadBuffer(0);
  GVar2 = (*__glewCheckFramebufferStatus)(0x8d40);
  if (GVar2 != 0x8cd5) {
    poVar6 = std::operator<<((ostream *)&std::cout,"error creating texture");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  (*__glewBindFramebuffer)(0x8d40,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_68,"box",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  this_00 = ResourcePack::get_mesh(_j,(string *)local_68);
  sVar3 = std::vector<float,_std::allocator<float>_>::size(&this_00->normals);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar3);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  (*__glewGenBuffers)(1,&this->object_vertex_buffer);
  (*__glewBindBuffer)(0x8892,this->object_vertex_buffer);
  p_Var1 = __glewBufferData;
  sVar3 = std::vector<float,_std::allocator<float>_>::size(&this_00->vertices);
  pfVar4 = std::vector<float,_std::allocator<float>_>::data(&this_00->vertices);
  (*p_Var1)(0x8892,sVar3 << 2,pfVar4,0x88e4);
  (*__glewGenBuffers)(1,&this->object_normal_buffer);
  (*__glewBindBuffer)(0x8892,this->object_normal_buffer);
  p_Var1 = __glewBufferData;
  sVar3 = std::vector<float,_std::allocator<float>_>::size(&this_00->normals);
  pfVar4 = std::vector<float,_std::allocator<float>_>::data(&this_00->normals);
  (*p_Var1)(0x8892,sVar3 << 2,pfVar4,0x88e4);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void Scene::update(ResourcePack& resource_pack) {
    grid_vertices.reserve((grid_height+1)*(grid_width+1));
    for(int i=0; i < grid_height+1; ++i) {
        for(int j=0; j < grid_width+1; ++j) {
            grid_vertices.push_back(grid_start_x+grid_cell_size*j);
            grid_vertices.push_back(-1.0);
            grid_vertices.push_back(grid_start_y+grid_cell_size*i);
            if ((i<grid_height) && (j<grid_height)) {
                grid_indices.push_back(i*(grid_height+1)+j);
                grid_indices.push_back(i*(grid_height+1)+j+1);
                grid_indices.push_back((i+1)*(grid_height+1)+j);
                grid_indices.push_back(i*(grid_height+1)+j+1);
                grid_indices.push_back((i+1)*(grid_height+1)+j);
                grid_indices.push_back((i+1)*(grid_height+1)+j+1);
            }
        }
    }
    glGenBuffers(1, &grid_vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, grid_vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(grid_vertices[0]) * grid_vertices.size(), grid_vertices.data(), GL_STATIC_DRAW);
    glGenBuffers(1, &grid_index_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, grid_index_buffer);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(grid_indices[0])*grid_indices.size(), grid_indices.data(), GL_STATIC_DRAW);

    glGenFramebuffers(1, &depth_map_framebuffer);

    glGenTextures(1, &depth_map);
    glBindTexture(GL_TEXTURE_2D, depth_map);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT, shadow_width, shadow_height, 0, GL_DEPTH_COMPONENT, GL_FLOAT, NULL);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

    glBindFramebuffer(GL_FRAMEBUFFER, depth_map_framebuffer);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depth_map, 0);
    glDrawBuffer(GL_NONE);
    glReadBuffer(GL_NONE);
    if(glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
        std::cout << "error creating texture" << std::endl;
    }
    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    std::string box_mesh("box");
        Mesh * objmesh = resource_pack.get_mesh(box_mesh);

    std::cout << objmesh->normals.size() << std::endl;

    glGenBuffers(1, &object_vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, object_vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(float) * objmesh->vertices.size(), objmesh->vertices.data(), GL_STATIC_DRAW);

    glGenBuffers(1, &object_normal_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, object_normal_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(float) * objmesh->normals.size(), objmesh->normals.data(), GL_STATIC_DRAW);
}